

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DoEdge2(Clipper *this,TEdge *edge1,TEdge *edge2,IntPoint *pt)

{
  EdgeSide EVar1;
  int iVar2;
  
  AddOutPt(this,edge2,pt);
  EVar1 = edge1->side;
  edge1->side = edge2->side;
  edge2->side = EVar1;
  iVar2 = edge1->outIdx;
  edge1->outIdx = edge2->outIdx;
  edge2->outIdx = iVar2;
  return;
}

Assistant:

void Clipper::DoEdge2(TEdge *edge1, TEdge *edge2, const IntPoint &pt)
{
  AddOutPt(edge2, pt);
  SwapSides(*edge1, *edge2);
  SwapPolyIndexes(*edge1, *edge2);
}